

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O1

void btPolyhedralContactClipping::clipFaceAgainstHull
               (btVector3 *separatingNormal,btConvexPolyhedron *hullA,btTransform *transA,
               btVertexArray *worldVertsB1,btScalar minDist,btScalar maxDist,Result *resultOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  btFace *pbVar12;
  int *piVar13;
  btVector3 *pbVar14;
  undefined8 uVar15;
  Result *pRVar16;
  btVertexArray *pbVar17;
  btVector3 *pbVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  btScalar *pbVar22;
  ulong uVar23;
  ulong uVar24;
  btVertexArray *pVtxIn;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  btVertexArray worldVertsB2;
  btVector3 point;
  btVertexArray local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  btFace *local_b0;
  undefined1 local_a8 [16];
  btVector3 local_98;
  btVector3 *local_80;
  Result *local_78;
  btConvexPolyhedron *local_70;
  btScalar local_68;
  undefined1 local_58 [16];
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_68 = minDist;
  local_f8.m_ownsMemory = true;
  local_f8.m_data = (btVector3 *)0x0;
  local_f8.m_size = 0;
  local_f8.m_capacity = 0;
  iVar10 = worldVertsB1->m_size;
  local_78 = resultOut;
  if (0 < (long)iVar10) {
    pbVar18 = (btVector3 *)btAlignedAllocInternal((long)iVar10 << 4,0x10);
    if (0 < (long)local_f8.m_size) {
      lVar21 = 0;
      do {
        puVar1 = (undefined8 *)((long)(local_f8.m_data)->m_floats + lVar21);
        uVar15 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar18->m_floats + lVar21);
        *puVar2 = *puVar1;
        puVar2[1] = uVar15;
        lVar21 = lVar21 + 0x10;
      } while ((long)local_f8.m_size * 0x10 != lVar21);
    }
    if ((local_f8.m_data != (btVector3 *)0x0) && (local_f8.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_f8.m_data);
    }
    local_f8.m_ownsMemory = true;
    local_f8.m_data = pbVar18;
    local_f8.m_capacity = iVar10;
  }
  local_f8.m_ownsMemory = true;
  uVar19 = (ulong)(hullA->m_faces).m_size;
  if ((long)uVar19 < 1) {
    uVar25 = 0xffffffff;
  }
  else {
    fVar28 = (transA->m_basis).m_el[0].m_floats[1];
    local_c8._0_4_ = fVar28;
    fVar26 = (transA->m_basis).m_el[0].m_floats[2];
    local_d8._0_4_ = fVar26;
    pbVar22 = ((hullA->m_faces).m_data)->m_plane + 2;
    fVar34 = 3.4028235e+38;
    uVar23 = 0xffffffff;
    uVar24 = 0;
    do {
      fVar35 = pbVar22[-2];
      fVar29 = pbVar22[-1];
      fVar3 = *pbVar22;
      fVar35 = (fVar3 * (transA->m_basis).m_el[2].m_floats[2] +
               fVar35 * (transA->m_basis).m_el[2].m_floats[0] +
               fVar29 * (transA->m_basis).m_el[2].m_floats[1]) * separatingNormal->m_floats[2] +
               ((transA->m_basis).m_el[1].m_floats[2] * fVar3 +
               (transA->m_basis).m_el[1].m_floats[0] * fVar35 +
               fVar29 * (transA->m_basis).m_el[1].m_floats[1]) * separatingNormal->m_floats[1] +
               (fVar26 * fVar3 + (transA->m_basis).m_el[0].m_floats[0] * fVar35 + fVar29 * fVar28) *
               separatingNormal->m_floats[0];
      if (fVar35 < fVar34) {
        uVar23 = uVar24 & 0xffffffff;
        fVar34 = fVar35;
      }
      uVar25 = (uint)uVar23;
      uVar24 = uVar24 + 1;
      pbVar22 = pbVar22 + 0xc;
    } while (uVar19 != uVar24);
  }
  if (-1 < (int)uVar25) {
    local_80 = separatingNormal;
    pbVar12 = (hullA->m_faces).m_data;
    local_b0 = pbVar12 + uVar25;
    uVar19 = (ulong)pbVar12[uVar25].m_indices.m_size;
    if (0 < (long)uVar19) {
      uVar23 = 0;
      pbVar17 = &local_f8;
      pVtxIn = worldVertsB1;
      local_70 = hullA;
      do {
        worldVertsB1 = pbVar17;
        piVar13 = (local_b0->m_indices).m_data;
        iVar10 = piVar13[uVar23];
        pbVar18 = (local_70->m_vertices).m_data;
        uVar23 = uVar23 + 1;
        uVar24 = 0;
        if (uVar23 != uVar19) {
          uVar24 = uVar23 & 0xffffffff;
        }
        iVar11 = piVar13[uVar24];
        fVar28 = pbVar18[iVar10].m_floats[0];
        fVar27 = fVar28 - pbVar18[iVar11].m_floats[0];
        fVar26 = pbVar18[iVar10].m_floats[1];
        fVar36 = fVar26 - pbVar18[iVar11].m_floats[1];
        fVar34 = pbVar18[iVar10].m_floats[2];
        fVar32 = fVar34 - pbVar18[iVar11].m_floats[2];
        fVar35 = (transA->m_basis).m_el[0].m_floats[0];
        local_a8 = ZEXT416((uint)fVar35);
        fVar29 = (transA->m_basis).m_el[0].m_floats[1];
        local_58 = ZEXT416((uint)fVar29);
        fVar3 = (transA->m_basis).m_el[0].m_floats[2];
        fVar37 = fVar3 * fVar32 + fVar35 * fVar27 + fVar36 * fVar29;
        fVar4 = (transA->m_basis).m_el[1].m_floats[0];
        fVar5 = (transA->m_basis).m_el[1].m_floats[1];
        fVar31 = local_b0->m_plane[0];
        fVar38 = local_b0->m_plane[1];
        local_c8 = ZEXT416((uint)fVar5);
        fVar6 = (transA->m_basis).m_el[1].m_floats[2];
        fVar39 = local_b0->m_plane[2];
        fVar30 = fVar6 * fVar39 + fVar4 * fVar31 + fVar5 * fVar38;
        fVar7 = (transA->m_basis).m_el[2].m_floats[1];
        local_d8 = ZEXT416((uint)fVar7);
        fVar8 = (transA->m_basis).m_el[2].m_floats[0];
        fVar9 = (transA->m_basis).m_el[2].m_floats[2];
        fVar33 = fVar32 * fVar6 + fVar27 * fVar4 + fVar5 * fVar36;
        fVar27 = fVar32 * fVar9 + fVar27 * fVar8 + fVar7 * fVar36;
        fVar32 = fVar39 * fVar9 + fVar31 * fVar8 + fVar38 * fVar7;
        fVar39 = fVar39 * fVar3 + fVar31 * fVar35 + fVar38 * fVar29;
        fVar31 = fVar30 * fVar37 - fVar39 * fVar33;
        fVar38 = -(fVar33 * fVar32 - fVar30 * fVar27);
        fVar39 = -(fVar27 * fVar39 - fVar32 * fVar37);
        local_98.m_floats[1] = fVar39;
        local_98.m_floats[0] = fVar38;
        local_98.m_floats[2] = -fVar31;
        local_98.m_floats[3] = 0.0;
        clipFace(pVtxIn,worldVertsB1,&local_98,
                 -(((fVar3 * fVar34 + fVar35 * fVar28 + fVar29 * fVar26 +
                    (transA->m_origin).m_floats[0]) * fVar38 +
                   fVar39 * (fVar6 * fVar34 + fVar4 * fVar28 + fVar5 * fVar26 +
                            (transA->m_origin).m_floats[1])) -
                  (fVar34 * fVar9 + fVar28 * fVar8 + fVar26 * fVar7 + (transA->m_origin).m_floats[2]
                  ) * fVar31));
        iVar10 = pVtxIn->m_size;
        lVar21 = (long)iVar10;
        if ((lVar21 < 1) && (iVar10 < 0)) {
          if (pVtxIn->m_capacity < 0) {
            if (pVtxIn->m_data != (btVector3 *)0x0) {
              if (pVtxIn->m_ownsMemory == true) {
                btAlignedFreeInternal(pVtxIn->m_data);
              }
              pVtxIn->m_data = (btVector3 *)0x0;
            }
            pVtxIn->m_ownsMemory = true;
            pVtxIn->m_data = (btVector3 *)0x0;
            pVtxIn->m_capacity = 0;
          }
          if (iVar10 < 0) {
            lVar20 = lVar21 << 4;
            do {
              puVar1 = (undefined8 *)((long)pVtxIn->m_data->m_floats + lVar20);
              *puVar1 = local_40;
              puVar1[1] = uStack_38;
              lVar20 = lVar20 + 0x10;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0);
          }
        }
        pVtxIn->m_size = 0;
        pbVar17 = pVtxIn;
        pVtxIn = worldVertsB1;
      } while (uVar23 != uVar19);
    }
    pRVar16 = local_78;
    pbVar18 = local_80;
    if (0 < worldVertsB1->m_size) {
      fVar28 = local_b0->m_plane[0];
      fVar26 = local_b0->m_plane[1];
      fVar34 = local_b0->m_plane[2];
      fVar35 = (transA->m_basis).m_el[0].m_floats[2] * fVar34 +
               (transA->m_basis).m_el[0].m_floats[0] * fVar28 +
               (transA->m_basis).m_el[0].m_floats[1] * fVar26;
      fVar29 = (transA->m_basis).m_el[1].m_floats[2] * fVar34 +
               (transA->m_basis).m_el[1].m_floats[0] * fVar28 +
               (transA->m_basis).m_el[1].m_floats[1] * fVar26;
      fVar26 = fVar34 * (transA->m_basis).m_el[2].m_floats[2] +
               fVar28 * (transA->m_basis).m_el[2].m_floats[0] +
               fVar26 * (transA->m_basis).m_el[2].m_floats[1];
      fVar28 = local_b0->m_plane[3] -
               ((transA->m_origin).m_floats[2] * fVar26 +
               (transA->m_origin).m_floats[0] * fVar35 + (transA->m_origin).m_floats[1] * fVar29);
      lVar21 = 0;
      lVar20 = 0;
      local_c8._0_4_ = fVar28;
      local_d8._0_4_ = fVar35;
      local_a8._0_4_ = fVar29;
      do {
        pbVar14 = worldVertsB1->m_data;
        fVar34 = *(float *)((long)pbVar14->m_floats + lVar21 + 8) * fVar26 +
                 *(float *)((long)pbVar14->m_floats + lVar21) * fVar35 +
                 *(float *)((long)pbVar14->m_floats + lVar21 + 4) * fVar29 + fVar28;
        uVar25 = -(uint)(fVar34 <= local_68);
        if ((float)(uVar25 & (uint)local_68 | ~uVar25 & (uint)fVar34) <= maxDist) {
          local_98.m_floats = *(btScalar (*) [4])((long)pbVar14->m_floats + lVar21);
          (*pRVar16->_vptr_Result[4])(pRVar16,pbVar18,&local_98);
          fVar28 = (float)local_c8._0_4_;
          fVar35 = (float)local_d8._0_4_;
          fVar29 = (float)local_a8._0_4_;
        }
        lVar20 = lVar20 + 1;
        lVar21 = lVar21 + 0x10;
      } while (lVar20 < worldVertsB1->m_size);
    }
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_f8);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipFaceAgainstHull(const btVector3& separatingNormal, const btConvexPolyhedron& hullA,  const btTransform& transA, btVertexArray& worldVertsB1, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	btVertexArray worldVertsB2;
	btVertexArray* pVtxIn = &worldVertsB1;
	btVertexArray* pVtxOut = &worldVertsB2;
	pVtxOut->reserve(pVtxIn->size());

	int closestFaceA=-1;
	{
		btScalar dmin = FLT_MAX;
		for(int face=0;face<hullA.m_faces.size();face++)
		{
			const btVector3 Normal(hullA.m_faces[face].m_plane[0], hullA.m_faces[face].m_plane[1], hullA.m_faces[face].m_plane[2]);
			const btVector3 faceANormalWS = transA.getBasis() * Normal;
		
			btScalar d = faceANormalWS.dot(separatingNormal);
			if (d < dmin)
			{
				dmin = d;
				closestFaceA = face;
			}
		}
	}
	if (closestFaceA<0)
		return;

	const btFace& polyA = hullA.m_faces[closestFaceA];

		// clip polygon to back of planes of all faces of hull A that are adjacent to witness face
	int numVerticesA = polyA.m_indices.size();
	for(int e0=0;e0<numVerticesA;e0++)
	{
		const btVector3& a = hullA.m_vertices[polyA.m_indices[e0]];
		const btVector3& b = hullA.m_vertices[polyA.m_indices[(e0+1)%numVerticesA]];
		const btVector3 edge0 = a - b;
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		btVector3 worldPlaneAnormal1 = transA.getBasis()* btVector3(polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);

		btVector3 planeNormalWS1 = -WorldEdge0.cross(worldPlaneAnormal1);//.cross(WorldEdge0);
		btVector3 worldA1 = transA*a;
		btScalar planeEqWS1 = -worldA1.dot(planeNormalWS1);
		
//int otherFace=0;
#ifdef BLA1
		int otherFace = polyA.m_connectedFaces[e0];
		btVector3 localPlaneNormal (hullA.m_faces[otherFace].m_plane[0],hullA.m_faces[otherFace].m_plane[1],hullA.m_faces[otherFace].m_plane[2]);
		btScalar localPlaneEq = hullA.m_faces[otherFace].m_plane[3];

		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
#else 
		btVector3 planeNormalWS = planeNormalWS1;
		btScalar planeEqWS=planeEqWS1;
		
#endif
		//clip face

		clipFace(*pVtxIn, *pVtxOut,planeNormalWS,planeEqWS);
		btSwap(pVtxIn,pVtxOut);
		pVtxOut->resize(0);
	}



//#define ONLY_REPORT_DEEPEST_POINT

	btVector3 point;
	

	// only keep points that are behind the witness face
	{
		btVector3 localPlaneNormal (polyA.m_plane[0],polyA.m_plane[1],polyA.m_plane[2]);
		btScalar localPlaneEq = polyA.m_plane[3];
		btVector3 planeNormalWS = transA.getBasis()*localPlaneNormal;
		btScalar planeEqWS=localPlaneEq-planeNormalWS.dot(transA.getOrigin());
		for (int i=0;i<pVtxIn->size();i++)
		{
			btVector3 vtx = pVtxIn->at(i);
			btScalar depth = planeNormalWS.dot(vtx)+planeEqWS;
			if (depth <=minDist)
			{
//				printf("clamped: depth=%f to minDist=%f\n",depth,minDist);
				depth = minDist;
			}

			if (depth <=maxDist)
			{
				btVector3 point = pVtxIn->at(i);
#ifdef ONLY_REPORT_DEEPEST_POINT
				curMaxDist = depth;
#else
#if 0
				if (depth<-3)
				{
					printf("error in btPolyhedralContactClipping depth = %f\n", depth);
					printf("likely wrong separatingNormal passed in\n");
				} 
#endif				
				resultOut.addContactPoint(separatingNormal,point,depth);
#endif
			}
		}
	}
#ifdef ONLY_REPORT_DEEPEST_POINT
	if (curMaxDist<maxDist)
	{
		resultOut.addContactPoint(separatingNormal,point,curMaxDist);
	}
#endif //ONLY_REPORT_DEEPEST_POINT

}